

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_CreateProperty(JSContext *ctx,JSObject *p,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  byte bVar1;
  ushort uVar2;
  JSClassExoticMethods *pJVar3;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *p_Var4;
  JSValue *pJVar5;
  int *piVar6;
  int64_t iVar7;
  BOOL BVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  JSValueUnion *pJVar12;
  char *fmt;
  int64_t iVar13;
  char cVar14;
  JSValue JVar15;
  JSValue obj;
  uint32_t idx;
  JSValueUnion local_48;
  JSValueUnion local_40;
  uint local_34;
  
  local_40 = (JSValueUnion)val.tag;
  local_48 = val.u;
  bVar1 = (p->field_0).header.dummy1;
  if ((bVar1 & 4) == 0) {
LAB_0010cf48:
    if (((p->field_0).header.dummy1 & 1) != 0) {
      uVar9 = flags & 7;
      if ((flags & 0x1800U) != 0) {
        uVar9 = flags & 5U | 0x10;
      }
      pJVar12 = (JSValueUnion *)add_property(ctx,p,prop,uVar9);
      if (pJVar12 == (JSValueUnion *)0x0) {
        return -1;
      }
      if ((flags & 0x1800U) == 0) {
        if (((uint)flags >> 0xd & 1) == 0) {
          pJVar12->int32 = 0;
          pJVar12[1].float64 = 1.48219693752374e-323;
        }
        else {
          if (0xfffffff4 < (uint)local_40.int32) {
            *(int *)local_48.ptr = *local_48.ptr + 1;
          }
          pJVar12->ptr = (void *)local_48;
          pJVar12[1] = local_40;
        }
        return 1;
      }
      pJVar12->float64 = 0.0;
      if ((((uint)flags >> 0xb & 1) != 0) && ((int)getter.tag == -1)) {
        uVar2 = *(ushort *)((long)getter.u.ptr + 6);
        if (uVar2 != 0xd) {
          if (uVar2 == 0x29) {
            cVar14 = *(char *)(*(long *)((long)getter.u.ptr + 0x30) + 0x20);
          }
          else {
            cVar14 = ctx->rt->class_array[uVar2].call != (JSClassCall *)0x0;
          }
          if (cVar14 == '\0') goto LAB_0010d027;
        }
        *(int *)getter.u.ptr = *getter.u.ptr + 1;
        *pJVar12 = getter.u;
      }
LAB_0010d027:
      pJVar12[1].float64 = 0.0;
      if ((((uint)flags >> 0xc & 1) != 0) && ((int)setter.tag == -1)) {
        uVar2 = *(ushort *)((long)setter.u.ptr + 6);
        if (uVar2 != 0xd) {
          if (uVar2 == 0x29) {
            cVar14 = *(char *)(*(long *)((long)setter.u.ptr + 0x30) + 0x20);
          }
          else {
            cVar14 = ctx->rt->class_array[uVar2].call != (JSClassCall *)0x0;
          }
          if (cVar14 == '\0') {
            return 1;
          }
        }
        *(int *)setter.u.ptr = *setter.u.ptr + 1;
        pJVar12[1] = setter.u;
      }
      return 1;
    }
  }
  else {
    uVar2 = (p->field_0).header.dummy2;
    if ((ulong)uVar2 == 2) {
      if ((bVar1 & 8) == 0) {
        BVar8 = JS_AtomIsArrayIndex(ctx,&idx,prop);
        if (BVar8 == 0) goto LAB_0010cf48;
      }
      else {
        if ((int)prop < 0) {
          idx = prop & 0x7fffffff;
          if (idx == (p->u).array.count) {
            if ((bVar1 & 1) == 0) goto LAB_0010cf4f;
            if (((flags & 0x1800U) == 0) && ((~((uint)flags >> 8 & flags) & 7) == 0)) {
              if (0xfffffff4 < (uint)val.tag) {
                *(int *)local_48.ptr = *local_48.ptr + 1;
              }
              iVar10 = add_fast_array_element(ctx,p,val,flags);
              return iVar10;
            }
          }
        }
        else {
          BVar8 = JS_AtomIsArrayIndex(ctx,&idx,prop);
          if (BVar8 == 0) goto LAB_0010cf48;
        }
        iVar10 = convert_fast_array_to_array(ctx,p);
        if (iVar10 != 0) {
          return -1;
        }
      }
      pJVar5 = (JSValue *)p->prop;
      JVar15 = *pJVar5;
      if (0xfffffff4 < (uint)pJVar5->tag) {
        *(int *)(pJVar5->u).ptr = *(pJVar5->u).ptr + 1;
      }
      JS_ToInt32Free(ctx,(int32_t *)&local_34,JVar15);
      uVar9 = idx + 1;
      if (local_34 < uVar9) {
        if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
          iVar10 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
          return iVar10;
        }
        dVar11 = (double)uVar9;
        if (-1 < (int)uVar9) {
          dVar11 = (double)(ulong)uVar9;
        }
        iVar13 = 7;
        if (-1 < (int)uVar9) {
          iVar13 = 0;
        }
        piVar6 = (int *)(pJVar5->u).ptr;
        iVar7 = pJVar5->tag;
        JVar15 = *pJVar5;
        (pJVar5->u).float64 = dVar11;
        pJVar5->tag = iVar13;
        if ((0xfffffff4 < (uint)iVar7) && (iVar10 = *piVar6, *piVar6 = iVar10 + -1, iVar10 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar15);
        }
      }
      goto LAB_0010cf48;
    }
    if ((ushort)(uVar2 - 0x15) < 9) {
      iVar10 = JS_AtomIsNumericIndex(ctx,prop);
      if (iVar10 != 0) {
        if (iVar10 < 0) {
          return -1;
        }
        fmt = "cannot create numeric index in typed array";
        goto LAB_0010cf56;
      }
      goto LAB_0010cf48;
    }
    if ((((uint)flags >> 0x11 & 1) != 0) ||
       (pJVar3 = ctx->rt->class_array[uVar2].exotic, pJVar3 == (JSClassExoticMethods *)0x0))
    goto LAB_0010cf48;
    p_Var4 = pJVar3->define_own_property;
    if (p_Var4 != (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *)0x0) {
      JVar15.tag = -1;
      JVar15.u.ptr = p;
      iVar10 = (*p_Var4)(ctx,JVar15,prop,val,getter,setter,flags);
      return iVar10;
    }
    if (uVar2 == 0x29) {
      obj.tag = -1;
      obj.u.ptr = p;
      uVar9 = js_proxy_isExtensible(ctx,obj);
      if ((int)uVar9 < 0) {
        return -1;
      }
    }
    else {
      uVar9 = bVar1 & 1;
    }
    if (uVar9 != 0) goto LAB_0010cf48;
  }
LAB_0010cf4f:
  fmt = "object is not extensible";
LAB_0010cf56:
  iVar10 = JS_ThrowTypeErrorOrFalse(ctx,flags,fmt);
  return iVar10;
}

Assistant:

static int JS_CreateProperty(JSContext *ctx, JSObject *p,
                             JSAtom prop, JSValueConst val,
                             JSValueConst getter, JSValueConst setter,
                             int flags)
{
    JSProperty *pr;
    int ret, prop_flags;

    /* add a new property or modify an existing exotic one */
    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY) {
            uint32_t idx, len;

            if (p->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    idx = __JS_AtomToUInt32(prop);
                    if (idx == p->u.array.count) {
                        if (!p->extensible)
                            goto not_extensible;
                        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET))
                            goto convert_to_array;
                        prop_flags = get_prop_flags(flags, 0);
                        if (prop_flags != JS_PROP_C_W_E)
                            goto convert_to_array;
                        return add_fast_array_element(ctx, p,
                                                      JS_DupValue(ctx, val), flags);
                    } else {
                        goto convert_to_array;
                    }
                } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                    /* convert the fast array to normal array */
                convert_to_array:
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto generic_array;
                }
            } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                JSProperty *plen;
                JSShapeProperty *pslen;
            generic_array:
                /* update the length field */
                plen = &p->prop[0];
                JS_ToUint32(ctx, &len, plen->u.value);
                if ((idx + 1) > len) {
                    pslen = get_shape_prop(p->shape);
                    if (unlikely(!(pslen->flags & JS_PROP_WRITABLE)))
                        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
                    /* XXX: should update the length after defining
                       the property */
                    len = idx + 1;
                    set_value(ctx, &plen->u.value, JS_NewUint32(ctx, len));
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "cannot create numeric index in typed array");
            }
        } else if (!(flags & JS_PROP_NO_EXOTIC)) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em) {
                if (em->define_own_property) {
                    return em->define_own_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p),
                                                   prop, val, getter, setter, flags);
                }
                ret = JS_IsExtensible(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                if (ret < 0)
                    return -1;
                if (!ret)
                    goto not_extensible;
            }
        }
    }

    if (!p->extensible) {
    not_extensible:
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        prop_flags = (flags & (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
            JS_PROP_GETSET;
    } else {
        prop_flags = flags & JS_PROP_C_W_E;
    }
    pr = add_property(ctx, p, prop, prop_flags);
    if (unlikely(!pr))
        return -1;
    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        pr->u.getset.getter = NULL;
        if ((flags & JS_PROP_HAS_GET) && JS_IsFunction(ctx, getter)) {
            pr->u.getset.getter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, getter));
        }
        pr->u.getset.setter = NULL;
        if ((flags & JS_PROP_HAS_SET) && JS_IsFunction(ctx, setter)) {
            pr->u.getset.setter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, setter));
        }
    } else {
        if (flags & JS_PROP_HAS_VALUE) {
            pr->u.value = JS_DupValue(ctx, val);
        } else {
            pr->u.value = JS_UNDEFINED;
        }
    }
    return TRUE;
}